

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs,char *filename)

{
  bool bVar1;
  pointer __x;
  pointer pcVar2;
  string value;
  string efp;
  
  GetExecutionFilePath_abi_cxx11_(&efp,this);
  if (filename == (char *)0x0) {
    filename = (char *)efp._M_dataplus;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(outArgs,((long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inArgs->
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pcVar2 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pcVar2 == (inArgs->
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&efp);
      return !bVar1;
    }
    __x = pcVar2;
    if (pcVar2->Delim == Bracket) {
LAB_0033bdec:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outArgs,&__x->Value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&value);
      ExpandVariablesInString(this,&value,false,false,false,filename,pcVar2->Line,false,false);
      __x = (pointer)&value;
      if (pcVar2->Delim == Quoted) goto LAB_0033bdec;
      cmSystemTools::ExpandListArgument(&value,outArgs,false);
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<std::string>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename)
    {
    filename = efp.c_str();
    }
  std::vector<cmListFileArgument>::const_iterator i;
  std::string value;
  outArgs.reserve(inArgs.size());
  for(i = inArgs.begin(); i != inArgs.end(); ++i)
    {
    // No expansion in a bracket argument.
    if(i->Delim == cmListFileArgument::Bracket)
      {
      outArgs.push_back(i->Value);
      continue;
      }
    // Expand the variables in the argument.
    value = i->Value;
    this->ExpandVariablesInString(value, false, false, false,
                                  filename, i->Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if(i->Delim == cmListFileArgument::Quoted)
      {
      outArgs.push_back(value);
      }
    else
      {
      cmSystemTools::ExpandListArgument(value, outArgs);
      }
    }
  return !cmSystemTools::GetFatalErrorOccured();
}